

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_add_text
               (nk_draw_list *list,nk_user_font *font,nk_rect rect,char *text,int len,
               float font_height,nk_color fg)

{
  float fVar1;
  nk_vec2 a;
  nk_vec2 c;
  nk_rune nVar2;
  nk_rune nVar3;
  int iVar4;
  float fVar5;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  nk_rune unicode;
  nk_rune next;
  nk_user_font_glyph g;
  nk_rune local_a8;
  nk_rune local_a4;
  nk_user_font *local_a0;
  float local_94;
  int local_90;
  int local_8c;
  undefined1 local_88 [16];
  nk_user_font_glyph local_70;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_48 = rect.y;
  local_a8 = 0;
  local_a4 = 0;
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2818,
                  "void nk_draw_list_add_text(struct nk_draw_list *, const struct nk_user_font *, struct nk_rect, const char *, int, float, struct nk_color)"
                 );
  }
  if ((((text != (char *)0x0 && len != 0) && (fVar1 = (list->clip_rect).x, fVar1 <= rect.x + rect.w)
       ) && (rect.x <= fVar1 + (list->clip_rect).w)) &&
     ((fVar1 = (list->clip_rect).y, fVar1 <= rect.h + local_48 &&
      (local_48 <= fVar1 + (list->clip_rect).h)))) {
    local_88._8_4_ = in_XMM0_Dc;
    local_88._0_8_ = rect._0_8_;
    local_88._12_4_ = in_XMM0_Dd;
    local_a0 = font;
    local_94 = font_height;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    nk_draw_list_push_image(list,font->texture);
    local_90 = nk_utf_decode(text,&local_a8,len);
    if (local_90 != 0) {
      fVar1 = (list->config).global_alpha;
      iVar4 = 0;
      do {
        nVar3 = local_a8;
        if (len - iVar4 == 0 || len < iVar4) {
          return;
        }
        if (local_90 == 0) {
          return;
        }
        if (local_a8 != 0xfffd) {
          local_8c = nk_utf_decode(text + (long)local_90 + (long)iVar4,&local_a4,len - iVar4);
          nVar2 = local_a4;
          if (local_a4 == 0xfffd) {
            nVar2 = 0;
          }
          (*local_a0->query)(local_a0->userdata,local_94,&local_70,local_a8,nVar2);
          fVar5 = local_70.offset.x + (float)local_88._0_4_;
          local_88._0_4_ = (float)local_88._0_4_ + local_70.xadvance;
          a.y = local_70.offset.y + local_48;
          a.x = fVar5;
          c.y = local_70.offset.y + local_48 + local_70.height;
          c.x = local_70.width + fVar5;
          nk_draw_list_push_rect_uv
                    (list,a,c,local_70.uv[0],local_70.uv[1],
                     (nk_color)
                     ((uint)fg & 0xffffff | (int)((float)((uint)fg >> 0x18) * fVar1) << 0x18));
          iVar4 = iVar4 + local_90;
          local_a8 = local_a4;
          local_90 = local_8c;
        }
      } while (nVar3 != 0xfffd);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_add_text(struct nk_draw_list *list, const struct nk_user_font *font,
    struct nk_rect rect, const char *text, int len, float font_height,
    struct nk_color fg)
{
    float x = 0;
    int text_len = 0;
    nk_rune unicode = 0;
    nk_rune next = 0;
    int glyph_len = 0;
    int next_glyph_len = 0;
    struct nk_user_font_glyph g;

    NK_ASSERT(list);
    if (!list || !len || !text) return;
    if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
        list->clip_rect.x, list->clip_rect.y, list->clip_rect.w, list->clip_rect.h)) return;

    nk_draw_list_push_image(list, font->texture);
    x = rect.x;
    glyph_len = nk_utf_decode(text, &unicode, len);
    if (!glyph_len) return;

    /* draw every glyph image */
    fg.a = (nk_byte)((float)fg.a * list->config.global_alpha);
    while (text_len < len && glyph_len) {
        float gx, gy, gh, gw;
        float char_width = 0;
        if (unicode == NK_UTF_INVALID) break;

        /* query currently drawn glyph information */
        next_glyph_len = nk_utf_decode(text + text_len + glyph_len, &next, (int)len - text_len);
        font->query(font->userdata, font_height, &g, unicode,
                    (next == NK_UTF_INVALID) ? '\0' : next);

        /* calculate and draw glyph drawing rectangle and image */
        gx = x + g.offset.x;
        gy = rect.y + g.offset.y;
        gw = g.width; gh = g.height;
        char_width = g.xadvance;
        nk_draw_list_push_rect_uv(list, nk_vec2(gx,gy), nk_vec2(gx + gw, gy+ gh),
            g.uv[0], g.uv[1], fg);

        /* offset next glyph */
        text_len += glyph_len;
        x += char_width;
        glyph_len = next_glyph_len;
        unicode = next;
    }
}